

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_xmlsave(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  xmlDocPtr pxVar9;
  int nr;
  int nr_00;
  int test_ret;
  int test_ret_2;
  xmlDocPtr in_RSI;
  xmlDocPtr pxVar10;
  undefined8 uVar11;
  undefined8 *puVar12;
  int test_ret_3;
  bool bVar13;
  int n_v;
  uint uVar14;
  
  if (quiet == '\0') {
    puts("Testing xmlsave : 9 of 15 functions ...");
  }
  bVar13 = true;
  iVar3 = 0;
  while (bVar13) {
    iVar1 = xmlMemBlocks();
    xmlSaveClose(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar13 = false;
    printf("Leak of %d blocks found in xmlSaveClose");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    iVar3 = iVar3 + -1;
  }
  function_tests = function_tests + 1;
  bVar13 = true;
  iVar1 = 0;
  while (bVar13) {
    pxVar10 = (xmlDocPtr)0x0;
    while( true ) {
      iVar2 = (int)in_RSI;
      iVar5 = (int)pxVar10;
      if (iVar5 == 4) break;
      iVar4 = xmlMemBlocks();
      pxVar9 = gen_xmlDocPtr(iVar5,iVar2);
      in_RSI = pxVar9;
      xmlSaveDoc(0);
      call_tests = call_tests + 1;
      des_xmlDocPtr((int)pxVar9,in_RSI,nr);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar4 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSaveDoc",(ulong)(uint)(iVar2 - iVar4));
        iVar1 = iVar1 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar10;
      }
      pxVar10 = (xmlDocPtr)(ulong)(iVar5 + 1);
    }
    bVar13 = false;
  }
  function_tests = function_tests + 1;
  iVar3 = iVar3 - iVar1;
  bVar13 = true;
  while (bVar13) {
    iVar1 = xmlMemBlocks();
    xmlSaveFinish(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar13 = false;
    printf("Leak of %d blocks found in xmlSaveFinish");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    iVar3 = iVar3 + -1;
  }
  function_tests = function_tests + 1;
  bVar13 = true;
  while (bVar13) {
    iVar1 = xmlMemBlocks();
    xmlSaveFlush(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar13 = false;
    printf("Leak of %d blocks found in xmlSaveFlush");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    iVar3 = iVar3 + -1;
  }
  function_tests = function_tests + 1;
  bVar13 = true;
  iVar1 = 0;
  while (bVar13) {
    puVar12 = &DAT_0015bd68;
    pxVar10 = (xmlDocPtr)0x0;
    while (uVar14 = (uint)pxVar10, uVar14 != 4) {
      iVar2 = xmlMemBlocks();
      if (uVar14 < 3) {
        in_RSI = (xmlDocPtr)*puVar12;
      }
      else {
        in_RSI = (xmlDocPtr)0x0;
      }
      xmlSaveSetIndentString();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar2 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSaveSetIndentString",(ulong)(uint)(iVar5 - iVar2));
        iVar1 = iVar1 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar10;
      }
      puVar12 = puVar12 + 1;
      pxVar10 = (xmlDocPtr)(ulong)(uVar14 + 1);
    }
    bVar13 = false;
  }
  function_tests = function_tests + 1;
  bVar13 = true;
  iVar2 = 0;
  while (bVar13) {
    pxVar10 = (xmlDocPtr)0x0;
    while( true ) {
      iVar5 = (int)in_RSI;
      iVar4 = (int)pxVar10;
      if (iVar4 == 3) break;
      iVar6 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar4,iVar5);
      xmlSaveTree(0,in_RSI);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar4,(xmlNodePtr)in_RSI,nr_00);
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar6 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSaveTree",(ulong)(uint)(iVar5 - iVar6));
        iVar2 = iVar2 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar10;
      }
      pxVar10 = (xmlDocPtr)(ulong)(iVar4 + 1);
    }
    bVar13 = false;
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  for (uVar14 = 0; uVar14 != 4; uVar14 = uVar14 + 1) {
    iVar4 = xmlMemBlocks();
    gen_int(uVar14,(int)in_RSI);
    xmlThrDefIndentTreeOutput();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar4 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlThrDefIndentTreeOutput",(ulong)(uint)(iVar6 - iVar4));
      iVar5 = iVar5 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar14;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar4 = 0;
  for (uVar14 = 0; uVar14 != 4; uVar14 = uVar14 + 1) {
    iVar6 = xmlMemBlocks();
    gen_int(uVar14,(int)in_RSI);
    xmlThrDefSaveNoEmptyTags();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlThrDefSaveNoEmptyTags",(ulong)(uint)(iVar7 - iVar6));
      iVar4 = iVar4 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar14;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  puVar12 = &DAT_0015bd68;
  iVar6 = 0;
  for (uVar14 = 0; uVar14 != 4; uVar14 = uVar14 + 1) {
    iVar7 = xmlMemBlocks();
    if (uVar14 < 3) {
      uVar11 = *puVar12;
    }
    else {
      uVar11 = 0;
    }
    xmlThrDefTreeIndentString(uVar11);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlThrDefTreeIndentString",(ulong)(uint)(iVar8 - iVar7));
      iVar6 = iVar6 + 1;
      printf(" %d",(ulong)uVar14);
      putchar(10);
    }
    puVar12 = puVar12 + 1;
  }
  function_tests = function_tests + 1;
  iVar6 = iVar5 + iVar4 + iVar1 + iVar2 + iVar6;
  uVar14 = -(iVar3 - iVar6);
  if (iVar3 != iVar6) {
    printf("Module xmlsave: %d errors\n",(ulong)uVar14);
  }
  return uVar14;
}

Assistant:

static int
test_xmlsave(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlsave : 9 of 15 functions ...\n");
    test_ret += test_xmlSaveClose();
    test_ret += test_xmlSaveDoc();
    test_ret += test_xmlSaveFinish();
    test_ret += test_xmlSaveFlush();
    test_ret += test_xmlSaveSetAttrEscape();
    test_ret += test_xmlSaveSetEscape();
    test_ret += test_xmlSaveSetIndentString();
    test_ret += test_xmlSaveToBuffer();
    test_ret += test_xmlSaveToFd();
    test_ret += test_xmlSaveToFilename();
    test_ret += test_xmlSaveTree();
    test_ret += test_xmlThrDefIndentTreeOutput();
    test_ret += test_xmlThrDefSaveNoEmptyTags();
    test_ret += test_xmlThrDefTreeIndentString();

    if (test_ret != 0)
	printf("Module xmlsave: %d errors\n", test_ret);
    return(test_ret);
}